

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigCheck.c
# Opt level: O3

void Aig_ManCheckPhase(Aig_Man_t *p)

{
  void *pvVar1;
  ulong uVar2;
  long lVar3;
  long lVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  
  lVar3 = (long)p->vObjs->nSize;
  if (0 < lVar3) {
    lVar4 = 0;
    do {
      pvVar1 = p->vObjs->pArray[lVar4];
      if (pvVar1 != (void *)0x0) {
        uVar5 = (uint)*(ulong *)((long)pvVar1 + 0x18);
        if ((uVar5 & 7) == 2) {
          if ((*(ulong *)((long)pvVar1 + 0x18) & 8) != 0) {
            __assert_fail("(int)pObj->fPhase == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigCheck.c"
                          ,0x9d,"void Aig_ManCheckPhase(Aig_Man_t *)");
          }
        }
        else {
          uVar2 = *(ulong *)((long)pvVar1 + 8);
          uVar6 = 1;
          uVar7 = 1;
          if (uVar2 != 0) {
            uVar7 = ((uint)uVar2 ^ *(uint *)((uVar2 & 0xfffffffffffffffe) + 0x18) >> 3) & 1;
          }
          uVar2 = *(ulong *)((long)pvVar1 + 0x10);
          if (uVar2 != 0) {
            uVar6 = (uint)uVar2 ^ *(uint *)((uVar2 & 0xfffffffffffffffe) + 0x18) >> 3;
          }
          if ((uVar5 >> 3 & 1) != (uVar6 & uVar7)) {
            __assert_fail("(int)pObj->fPhase == (Aig_ObjPhaseReal(Aig_ObjChild0(pObj)) & Aig_ObjPhaseReal(Aig_ObjChild1(pObj)))"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigCheck.c"
                          ,0x9f,"void Aig_ManCheckPhase(Aig_Man_t *)");
          }
        }
      }
      lVar4 = lVar4 + 1;
    } while (lVar3 != lVar4);
  }
  return;
}

Assistant:

void Aig_ManCheckPhase( Aig_Man_t * p )
{
    Aig_Obj_t * pObj;
    int i;
    Aig_ManForEachObj( p, pObj, i )
        if ( Aig_ObjIsCi(pObj) )
            assert( (int)pObj->fPhase == 0 );
        else
            assert( (int)pObj->fPhase == (Aig_ObjPhaseReal(Aig_ObjChild0(pObj)) & Aig_ObjPhaseReal(Aig_ObjChild1(pObj))) );
}